

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivide.c
# Opt level: O3

void Mvc_CoverDivideInternal
               (Mvc_Cover_t *pCover,Mvc_Cover_t *pDiv,Mvc_Cover_t **ppQuo,Mvc_Cover_t **ppRem)

{
  int *piVar1;
  int iVar2;
  Mvc_Cube_t *pMVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Mvc_Cover_t *pCover_00;
  Mvc_Cover_t *pCover_01;
  int *__ptr;
  Mvc_Cube_t *pMVar9;
  Mvc_Cube_t **ppMVar10;
  Mvc_List_t *pMVar11;
  Mvc_Cube_t **ppMVar12;
  Mvc_Cube_t *pMVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  bool bVar25;
  Mvc_List_t *pList;
  Mvc_List_t *pList_3;
  ulong local_68;
  
  uVar4 = Mvc_CoverReadCubeNum(pDiv);
  uVar5 = Mvc_CoverReadCubeNum(pCover);
  if (uVar4 == 1) {
    iVar6 = Mvc_CoverIsOneLiteral(pDiv);
    if (iVar6 == 0) {
      Mvc_CoverDivideByCube(pCover,pDiv,ppQuo,ppRem);
      return;
    }
    Mvc_CoverDivideByLiteral(pCover,pDiv,ppQuo,ppRem);
    return;
  }
  pCover_00 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  pCover_01 = Mvc_CoverAlloc(pCover->pMem,pCover->nBits);
  Mvc_CoverAllocateMask(pDiv);
  Mvc_CoverSupport(pDiv,pDiv->pMask);
  Mvc_CoverSort(pDiv,(Mvc_Cube_t *)0x0,Mvc_CubeCompareInt);
  Mvc_CoverSort(pCover,pDiv->pMask,Mvc_CubeCompareIntOutsideAndUnderMask);
  __ptr = (int *)malloc((long)(int)uVar5 * 4 + 4);
  Mvc_CoverList2Array(pCover);
  Mvc_CoverList2Array(pDiv);
  *__ptr = 0;
  if ((int)uVar5 < 2) {
    __ptr[1] = uVar5;
    uVar7 = 1;
  }
  else {
    ppMVar10 = pCover->pCubes;
    uVar7 = 1;
    uVar18 = 1;
    do {
      pMVar13 = ppMVar10[uVar18 - 1];
      pMVar9 = ppMVar10[uVar18];
      uVar22 = *(uint *)&pMVar13->field_0x8 & 0xffffff;
      if (uVar22 == 0) {
        uVar22 = pDiv->pMask->pData[0];
        uVar21 = pMVar13->pData[0] | uVar22;
        uVar22 = uVar22 | pMVar9->pData[0];
LAB_00422eea:
        if (uVar21 != uVar22) {
LAB_00422eef:
          lVar20 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          __ptr[lVar20] = (int)uVar18;
        }
      }
      else {
        if (uVar22 == 1) {
          uVar22 = pDiv->pMask->pData[0];
          if ((pMVar13->pData[0] | uVar22) == (uVar22 | pMVar9->pData[0])) {
            uVar22 = *(uint *)&pDiv->pMask->field_0x14;
            uVar21 = *(uint *)&pMVar13->field_0x14 | uVar22;
            uVar22 = uVar22 | *(uint *)&pMVar9->field_0x14;
            goto LAB_00422eea;
          }
          goto LAB_00422eef;
        }
        do {
          uVar21 = pDiv->pMask->pData[uVar22];
          if ((pMVar13->pData[uVar22] | uVar21) != (uVar21 | pMVar9->pData[uVar22]))
          goto LAB_00422eef;
          bVar25 = 0 < (int)uVar22;
          uVar22 = uVar22 - 1;
        } while (bVar25);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar5);
    __ptr[(int)uVar7] = uVar5;
    if ((int)uVar7 < 1) {
      uVar22 = 0;
LAB_00422f48:
      if (uVar22 != uVar5) {
        __assert_fail("nCubes == nCubesC",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcDivide.c"
                      ,0xf6,
                      "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                     );
      }
      free(__ptr);
      *ppRem = pCover_01;
      *ppQuo = pCover_00;
      return;
    }
  }
  pMVar11 = &pCover_01->lCubes;
  uVar21 = 1;
  if (1 < (int)uVar4) {
    uVar21 = uVar4;
  }
  uVar18 = 0;
  uVar22 = 0;
  iVar6 = *__ptr;
LAB_00422fe6:
  iVar2 = __ptr[uVar18 + 1];
  iVar24 = iVar2 - iVar6;
  if ((int)uVar4 <= iVar24) {
    ppMVar10 = pCover->pCubes;
    lVar20 = (long)iVar6;
    if (iVar2 - iVar6 != 0 && iVar6 <= iVar2) {
      lVar15 = lVar20;
      do {
        ppMVar10[lVar15]->nOnes = 1;
        lVar15 = lVar15 + 1;
      } while (iVar2 != lVar15);
    }
    ppMVar12 = pDiv->pCubes;
    ppMVar10 = ppMVar10 + lVar20;
    iVar19 = 0;
    lVar15 = 1;
    local_68 = 1;
    do {
      pMVar13 = *ppMVar12;
      iVar14 = (int)lVar15;
      lVar23 = 0;
      lVar15 = lVar20 * 8 + (long)iVar14 * 8;
      while( true ) {
        pMVar9 = *ppMVar10;
        iVar8 = Mvc_CubeCompareIntUnderMask(pMVar9,pMVar13,pDiv->pMask);
        uVar17 = (uint)lVar23;
        if (iVar8 != -1) break;
        if ((int)(((iVar2 - iVar6) - iVar14) + uVar17) < (int)(uVar4 - iVar19)) goto LAB_004231f2;
        lVar23 = lVar23 + -1;
        ppMVar10 = (Mvc_Cube_t **)(lVar15 + (long)pCover->pCubes);
        lVar15 = lVar15 + 8;
      }
      if (iVar8 == 1) {
LAB_004231f2:
        if (iVar6 < iVar2) {
          do {
            pMVar9 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar20]);
            pMVar13 = (Mvc_Cube_t *)pMVar11;
            if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
              pMVar13 = (pCover_01->lCubes).pTail;
            }
            pMVar13->pNext = pMVar9;
            (pCover_01->lCubes).pTail = pMVar9;
            pMVar9->pNext = (Mvc_Cube_t *)0x0;
            piVar1 = &(pCover_01->lCubes).nItems;
            *piVar1 = *piVar1 + 1;
            lVar20 = lVar20 + 1;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
          uVar22 = (uVar22 + iVar2) - iVar6;
        }
        goto LAB_00423282;
      }
      pMVar9->nOnes = 0;
      if (local_68 == uVar4) goto LAB_00423298;
      if (iVar19 == uVar21 - 1) {
        __assert_fail("iCubeD < nCubesD",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcDivide.c"
                      ,0xcf,
                      "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                     );
      }
      iVar8 = (iVar14 + iVar6) - uVar17;
      if ((int)uVar5 <= iVar8) {
        __assert_fail("pGroups[g]+iCubeC < nCubesC",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mvc/mvcDivide.c"
                      ,0xd3,
                      "void Mvc_CoverDivideInternal(Mvc_Cover_t *, Mvc_Cover_t *, Mvc_Cover_t **, Mvc_Cover_t **)"
                     );
      }
      iVar19 = iVar19 + 1;
      ppMVar12 = pDiv->pCubes + local_68;
      local_68 = local_68 + 1;
      lVar15 = (iVar14 - lVar23) + 1;
      ppMVar10 = pCover->pCubes + iVar8;
    } while( true );
  }
  if (iVar6 < iVar2) {
    lVar20 = (long)iVar6;
    do {
      pMVar9 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar20]);
      pMVar13 = (Mvc_Cube_t *)pMVar11;
      if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar13 = (pCover_01->lCubes).pTail;
      }
      pMVar13->pNext = pMVar9;
      (pCover_01->lCubes).pTail = pMVar9;
      pMVar9->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover_01->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
      lVar20 = lVar20 + 1;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
    uVar22 = (uVar22 + iVar2) - iVar6;
  }
  goto LAB_00423282;
LAB_00423298:
  if (iVar6 < iVar2) {
    do {
      if (pCover->pCubes[lVar20]->nOnes != 0) {
        pMVar9 = Mvc_CubeDup(pCover_01,pCover->pCubes[lVar20]);
        pMVar13 = (Mvc_Cube_t *)pMVar11;
        if ((pCover_01->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar13 = (pCover_01->lCubes).pTail;
        }
        pMVar13->pNext = pMVar9;
        (pCover_01->lCubes).pTail = pMVar9;
        pMVar9->pNext = (Mvc_Cube_t *)0x0;
        piVar1 = &(pCover_01->lCubes).nItems;
        *piVar1 = *piVar1 + 1;
        uVar22 = uVar22 + 1;
      }
      lVar20 = lVar20 + 1;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  pMVar9 = Mvc_CubeAlloc(pCover_00);
  pMVar13 = pCover->pCubes[(int)(~uVar17 + iVar6 + iVar14)];
  uVar17 = *(uint *)&pMVar13->field_0x8 & 0xffffff;
  if (uVar17 == 0) {
    pMVar9->pData[0] = ~pDiv->pMask->pData[0] & pMVar13->pData[0];
  }
  else if (uVar17 == 1) {
    pMVar3 = pDiv->pMask;
    pMVar9->pData[0] = ~pMVar3->pData[0] & pMVar13->pData[0];
    *(uint *)&pMVar9->field_0x14 = ~*(uint *)&pMVar3->field_0x14 & *(uint *)&pMVar13->field_0x14;
  }
  else {
    pMVar3 = pDiv->pMask;
    uVar16 = (ulong)(*(uint *)&pMVar13->field_0x8 & 0xffffff);
    do {
      pMVar9->pData[uVar16] = ~pMVar3->pData[uVar16] & pMVar13->pData[uVar16];
      bVar25 = uVar16 != 0;
      uVar16 = uVar16 - 1;
    } while (bVar25);
  }
  pMVar13 = (Mvc_Cube_t *)&pCover_00->lCubes;
  if ((pCover_00->lCubes).pHead != (Mvc_Cube_t *)0x0) {
    pMVar13 = (pCover_00->lCubes).pTail;
  }
  pMVar13->pNext = pMVar9;
  (pCover_00->lCubes).pTail = pMVar9;
  pMVar9->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover_00->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  uVar22 = uVar22 + uVar4;
LAB_00423282:
  uVar18 = uVar18 + 1;
  iVar6 = iVar2;
  if (uVar18 == uVar7) goto LAB_00422f48;
  goto LAB_00422fe6;
}

Assistant:

void Mvc_CoverDivideInternal( Mvc_Cover_t * pCover, Mvc_Cover_t * pDiv, Mvc_Cover_t ** ppQuo, Mvc_Cover_t ** ppRem )
{
    Mvc_Cover_t * pQuo, * pRem;
    Mvc_Cube_t * pCubeC, * pCubeD, * pCubeCopy;
    Mvc_Cube_t * pCube1, * pCube2;
    int * pGroups, nGroups;    // the cube groups
    int nCubesC, nCubesD, nMerges, iCubeC, iCubeD;
    int iMerge = -1; // Suppress "might be used uninitialized"
    int fSkipG, GroupSize, g, c, RetValue;
    int nCubes;

    // get cover sizes
    nCubesD = Mvc_CoverReadCubeNum( pDiv );
    nCubesC = Mvc_CoverReadCubeNum( pCover );

    // check trivial cases
    if ( nCubesD == 1 )
    {
        if ( Mvc_CoverIsOneLiteral( pDiv ) )
            Mvc_CoverDivideByLiteral( pCover, pDiv, ppQuo, ppRem );
        else
            Mvc_CoverDivideByCube( pCover, pDiv, ppQuo, ppRem );
        return;
    }

    // create the divisor and the remainder 
    pQuo = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );
    pRem = Mvc_CoverAlloc( pCover->pMem, pCover->nBits );

    // get the support of the divisor
    Mvc_CoverAllocateMask( pDiv );
    Mvc_CoverSupport( pDiv, pDiv->pMask );

    // sort the cubes of the divisor
    Mvc_CoverSort( pDiv, NULL, Mvc_CubeCompareInt );
    // sort the cubes of the cover
    Mvc_CoverSort( pCover, pDiv->pMask, Mvc_CubeCompareIntOutsideAndUnderMask );

    // allocate storage for cube groups
    pGroups = MEM_ALLOC( pCover->pMem, int, nCubesC + 1 );

    // mask contains variables in the support of Div
    // split the cubes into groups using the mask
    Mvc_CoverList2Array( pCover );
    Mvc_CoverList2Array( pDiv );
    pGroups[0] = 0;
    nGroups    = 1;
    for ( c = 1; c < nCubesC; c++ )
    {
        // get the cubes
        pCube1 = pCover->pCubes[c-1];
        pCube2 = pCover->pCubes[c  ];
        // compare the cubes
        Mvc_CubeBitEqualOutsideMask( RetValue, pCube1, pCube2, pDiv->pMask );
        if ( !RetValue )
            pGroups[nGroups++] = c;
    }
    // finish off the last group
    pGroups[nGroups] = nCubesC;

    // consider each group separately and decide
    // whether it can produce a quotient cube
    nCubes = 0;
    for ( g = 0; g < nGroups; g++ )
    {
        // if the group has less than nCubesD cubes, 
        // there is no way it can produce the quotient cube
        // copy the cubes to the remainder
        GroupSize = pGroups[g+1] - pGroups[g];
        if ( GroupSize < nCubesD )
        {
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // mark the cubes as those that should be added to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            Mvc_CubeSetSize( pCover->pCubes[c], 1 );

        // go through the cubes in the group and at the same time
        // go through the cubes in the divisor
        iCubeD  = 0;
        iCubeC  = 0;
        pCubeD  = pDiv->pCubes[iCubeD++];
        pCubeC  = pCover->pCubes[pGroups[g]+iCubeC++];
        fSkipG  = 0;
        nMerges = 0;

        while ( 1 )
        {
            // compare the topmost cubes in F and in D
            RetValue = Mvc_CubeCompareIntUnderMask( pCubeC, pCubeD, pDiv->pMask );
            // cube are ordered in increasing order of their int value
            if ( RetValue == -1 ) // pCubeC is above pCubeD
            {  // cube in C should be added to the remainder
                // check that there is enough cubes in the group
                if ( GroupSize - iCubeC < nCubesD - nMerges )
                {
                    fSkipG = 1;
                    break;
                }
                // get the next cube in the cover
                pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
                continue;
            }
            if ( RetValue == 1 ) // pCubeD is above pCubeC
            { // given cube in D does not have a corresponding cube in the cover
                fSkipG = 1;
                break;
            }
            // mark the cube as the one that should NOT be added to the remainder
            Mvc_CubeSetSize( pCubeC, 0 );
            // remember this merged cube
            iMerge = iCubeC-1;
            nMerges++;

            // stop if we considered the last cube of the group
            if ( iCubeD == nCubesD )
                break;

            // advance the cube of the divisor
            assert( iCubeD < nCubesD );
            pCubeD = pDiv->pCubes[iCubeD++];

            // advance the cube of the group
            assert( pGroups[g]+iCubeC < nCubesC );
            pCubeC = pCover->pCubes[pGroups[g]+iCubeC++];
        }

        if ( fSkipG )
        { 
            // the group has failed, add all the cubes to the remainder
            for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCover->pCubes[c] );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
            continue;
        }

        // the group has worked, add left-over cubes to the remainder
        for ( c = pGroups[g]; c < pGroups[g+1]; c++ )
        {
            pCubeC = pCover->pCubes[c];
            if ( Mvc_CubeReadSize(pCubeC) )
            {
                pCubeCopy = Mvc_CubeDup( pRem, pCubeC );
                Mvc_CoverAddCubeTail( pRem, pCubeCopy );
                nCubes++;
            }
        }

        // create the quotient cube
        pCube1 = Mvc_CubeAlloc( pQuo );
        Mvc_CubeBitSharp( pCube1, pCover->pCubes[pGroups[g]+iMerge], pDiv->pMask );
        // add the cube to the quotient
        Mvc_CoverAddCubeTail( pQuo, pCube1 );
        nCubes += nCubesD;
    }
    assert( nCubes == nCubesC );

    // deallocate the memory
    MEM_FREE( pCover->pMem, int, nCubesC + 1, pGroups );

    // return the results
    *ppRem = pRem;
    *ppQuo = pQuo;
//    Mvc_CoverVerifyDivision( pCover, pDiv, pQuo, pRem );
}